

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9CexMerge(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint iFrBeg;
  Abc_Cex_t *pAVar4;
  char *pcVar5;
  uint local_34;
  
  iFrBeg = 0;
  Extra_UtilGetoptReset();
  local_34 = 1000000000;
  bVar1 = false;
  do {
    while( true ) {
      while (iVar3 = Extra_UtilGetopt(argc,argv,"FGvh"), iVar2 = globalUtilOptind, iVar3 == 0x76) {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar3 == -1) {
        pAVar4 = pAbc->pCex;
        if (pAVar4 == (Abc_Cex_t *)0x0) {
          pcVar5 = "There is no current cex.\n";
        }
        else if (pAbc->pCex2 == (Abc_Cex_t *)0x0) {
          pcVar5 = "There is no saved cex.\n";
        }
        else if ((int)(local_34 - iFrBeg) < pAVar4->iFrame) {
          pcVar5 = "Current CEX does not allow to shorten the saved CEX.\n";
        }
        else {
          pAVar4 = Abc_CexMerge(pAbc->pCex2,pAVar4,iFrBeg,local_34);
          if (pAVar4 != (Abc_Cex_t *)0x0) {
            free(pAbc->pCex2);
            pAbc->pCex2 = pAVar4;
            return 0;
          }
          pcVar5 = "Merging CEXes has failed.\n";
        }
        Abc_Print(1,pcVar5);
        return 0;
      }
      if (iVar3 == 0x68) goto LAB_00262c0d;
      if (iVar3 == 0x47) break;
      if (iVar3 != 0x46) {
        Abc_Print(-2,"Unknown switch.\n");
        goto LAB_00262c0d;
      }
      if (argc <= globalUtilOptind) {
        pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
LAB_00262d13:
        Abc_Print(-1,pcVar5);
        goto LAB_00262c0d;
      }
      iFrBeg = atoi(argv[globalUtilOptind]);
      globalUtilOptind = iVar2 + 1;
      if ((int)iFrBeg < 0) goto LAB_00262c0d;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-G\" should be followed by an integer.\n";
      goto LAB_00262d13;
    }
    local_34 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
  } while (-1 < (int)local_34);
LAB_00262c0d:
  Abc_Print(-2,"usage: &cexmerge [-FG num] [-vh]\n");
  Abc_Print(-2,"\t         merges the current CEX into the saved one\n");
  Abc_Print(-2,"\t         and sets the resulting CEX as the saved one\n");
  Abc_Print(-2,"\t-F num : 0-based number of the starting frame [default = %d]\n",(ulong)iFrBeg);
  Abc_Print(-2,"\t-G num : 0-based number of the ending frame [default = %d]\n",(ulong)local_34);
  pcVar5 = "yes";
  if (!bVar1) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandAbc9CexMerge( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Cex_t * pCexNew;
    int c;
    int iFrStart = 0;
    int iFrStop  = ABC_INFINITY;
    int fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStop < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }
    if ( pAbc->pCex2 == NULL )
    {
        Abc_Print( 1, "There is no saved cex.\n");
        return 0;
    }
    if ( iFrStop - iFrStart < pAbc->pCex->iFrame )
    {
        Abc_Print( 1, "Current CEX does not allow to shorten the saved CEX.\n");
        return 0;
    }
    pCexNew = Abc_CexMerge( pAbc->pCex2, pAbc->pCex, iFrStart, iFrStop );
    if ( pCexNew == NULL )
    {
        Abc_Print( 1, "Merging CEXes has failed.\n");
        return 0;
    }
    // replace the saved CEX
    ABC_FREE( pAbc->pCex2 );
    pAbc->pCex2 = pCexNew;
    return 0;

usage:
    Abc_Print( -2, "usage: &cexmerge [-FG num] [-vh]\n" );
    Abc_Print( -2, "\t         merges the current CEX into the saved one\n" );
    Abc_Print( -2, "\t         and sets the resulting CEX as the saved one\n" );
    Abc_Print( -2, "\t-F num : 0-based number of the starting frame [default = %d]\n", iFrStart );
    Abc_Print( -2, "\t-G num : 0-based number of the ending frame [default = %d]\n",   iFrStop );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}